

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_expand_data.cc
# Opt level: O0

void __thiscall
ctemplate::PerExpandData::InsertForModifiers(PerExpandData *this,char *key,void *value)

{
  unordered_map<const_char_*,_const_void_*,_ctemplate::StringHash,_ctemplate::PerExpandData::DataEq,_std::allocator<std::pair<const_char_*const,_const_void_*>_>_>
  *this_00;
  mapped_type *ppvVar1;
  void *value_local;
  char *key_local;
  PerExpandData *this_local;
  
  value_local = key;
  key_local = (char *)this;
  if (this->map_ == (DataMap *)0x0) {
    this_00 = (unordered_map<const_char_*,_const_void_*,_ctemplate::StringHash,_ctemplate::PerExpandData::DataEq,_std::allocator<std::pair<const_char_*const,_const_void_*>_>_>
               *)operator_new(0x38);
    std::
    unordered_map<const_char_*,_const_void_*,_ctemplate::StringHash,_ctemplate::PerExpandData::DataEq,_std::allocator<std::pair<const_char_*const,_const_void_*>_>_>
    ::unordered_map(this_00);
    this->map_ = this_00;
  }
  ppvVar1 = std::
            unordered_map<const_char_*,_const_void_*,_ctemplate::StringHash,_ctemplate::PerExpandData::DataEq,_std::allocator<std::pair<const_char_*const,_const_void_*>_>_>
            ::operator[](this->map_,(key_type *)&value_local);
  *ppvVar1 = value;
  return;
}

Assistant:

void PerExpandData::InsertForModifiers(const char* key, const void* value) {
  if (!map_)
    map_ = new DataMap;
  (*map_)[key] = value;
}